

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

string * __thiscall
soul::getDescriptionOfTimeInSeconds_abi_cxx11_
          (string *__return_storage_ptr__,soul *this,double numSeconds)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  size_t in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (numSeconds < 1.0) {
    getDescriptionOfTimeInSeconds[abi:cxx11](double)::$_0::operator()[abi_cxx11_
              (&local_30,(void *)((ulong)(numSeconds < 0.1) + 1),numSeconds * 1000.0,in_RDX);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  }
  else {
    getDescriptionOfTimeInSeconds[abi:cxx11](double)::$_0::operator()[abi_cxx11_
              (&local_30,(void *)0x2,numSeconds,in_RDX);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getDescriptionOfTimeInSeconds (double numSeconds)
{
    auto toStringWithDecPlaces = [] (double n, size_t numDecPlaces)
    {
        auto s = choc::text::floatToString (n, (int) numDecPlaces);
        auto dot = s.find ('.');
        return dot == std::string::npos ? s : s.substr (0, std::min (s.length(), dot + 1 + numDecPlaces));
    };

    return numSeconds < 1.0 ? (toStringWithDecPlaces (numSeconds * 1000.0, numSeconds < 0.1 ? 2 : 1) + " ms")
                            : (toStringWithDecPlaces (numSeconds, 2) + " sec");
}